

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

void __thiscall raft_functional_common::TestSm::~TestSm(TestSm *this)

{
  (this->super_state_machine)._vptr_state_machine = (_func_int **)&PTR__TestSm_00606bc8;
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&(this->serversForCommit).super__List_base<int,_std::allocator<int>_>);
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree(&(this->openedUserCtxs)._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&(this->rollbacks).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  ::~_Rb_tree(&(this->commits)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  ::~_Rb_tree(&(this->preCommits)._M_t);
  return;
}

Assistant:

~TestSm() {}